

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::PatchVertexCountCase::iterate(PatchVertexCountCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLenum err;
  TestLog *this_00;
  undefined4 extraout_var;
  char *pcVar3;
  ShaderProgram *this_01;
  MessageBuilder *pMVar4;
  size_type sVar5;
  reference data;
  RenderContext *context;
  Archive *archive;
  float fVar6;
  VertexArrayBinding *local_3a8;
  ConstPixelBufferAccess local_328;
  ConstPixelBufferAccess local_300;
  undefined1 local_2d1;
  undefined1 local_2d0 [7];
  bool success;
  TextureLevel reference;
  Surface rendered;
  allocator<char> local_271;
  string local_270;
  undefined1 *local_250;
  undefined1 local_248 [8];
  VertexArrayBinding attrBindings [1];
  int local_1ec;
  float f;
  int i;
  vector<float,_std::allocator<float>_> attributeData;
  MessageBuilder local_1c0;
  Functions *local_40;
  Functions *gl;
  undefined1 local_30 [4];
  deUint32 programGL;
  RandomViewport viewport;
  RenderContext *renderCtx;
  TestLog *log;
  PatchVertexCountCase *this_local;
  
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  viewport._8_8_ = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*((RenderContext *)viewport._8_8_)->_vptr_RenderContext[4])();
  pcVar3 = tcu::TestNode::getName((TestNode *)this);
  dVar2 = deStringHash(pcVar3);
  deqp::gls::TextureTestUtil::RandomViewport::RandomViewport
            ((RandomViewport *)local_30,(RenderTarget *)CONCAT44(extraout_var,iVar1),0x100,0x100,
             dVar2);
  this_01 = de::SharedPtr<const_glu::ShaderProgram>::operator->(&this->m_program);
  gl._4_4_ = glu::ShaderProgram::getProgram(this_01);
  local_40 = (Functions *)(**(code **)(*(long *)viewport._8_8_ + 0x18))();
  setViewport(local_40,(RandomViewport *)local_30);
  (*local_40->clearColor)(0.0,0.0,0.0,1.0);
  (*local_40->useProgram)(gl._4_4_);
  tcu::TestLog::operator<<(&local_1c0,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar4 = tcu::MessageBuilder::operator<<(&local_1c0,(char (*) [27])"Note: input patch size is ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_inputPatchSize);
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,(char (*) [24])", output patch size is ");
  pMVar4 = tcu::MessageBuilder::operator<<(pMVar4,&this->m_outputPatchSize);
  tcu::MessageBuilder::operator<<(pMVar4,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1c0);
  std::vector<float,_std::allocator<float>_>::vector((vector<float,_std::allocator<float>_> *)&f);
  std::vector<float,_std::allocator<float>_>::reserve
            ((vector<float,_std::allocator<float>_> *)&f,(long)this->m_inputPatchSize);
  for (local_1ec = 0; local_1ec < this->m_inputPatchSize; local_1ec = local_1ec + 1) {
    fVar6 = (float)local_1ec / (float)(this->m_inputPatchSize + -1);
    attrBindings[0].pointer.data._4_4_ = fVar6 * fVar6;
    std::vector<float,_std::allocator<float>_>::push_back
              ((vector<float,_std::allocator<float>_> *)&f,
               (value_type_conflict2 *)((long)&attrBindings[0].pointer.data + 4));
  }
  (*local_40->patchParameteri)(0x8e72,this->m_inputPatchSize);
  (*local_40->clear)(0x4000);
  local_250 = local_248;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_270,"in_v_attr",&local_271);
  sVar5 = std::vector<float,_std::allocator<float>_>::size
                    ((vector<float,_std::allocator<float>_> *)&f);
  data = std::vector<float,_std::allocator<float>_>::operator[]
                   ((vector<float,_std::allocator<float>_> *)&f,0);
  glu::va::Float((VertexArrayBinding *)local_248,&local_270,1,(int)sVar5,0,data);
  std::__cxx11::string::~string((string *)&local_270);
  std::allocator<char>::~allocator(&local_271);
  context = gles31::Context::getRenderContext((this->super_TestCase).m_context);
  dVar2 = gl._4_4_;
  glu::pr::Patches((PrimitiveList *)&rendered.m_pixels.m_cap,this->m_inputPatchSize);
  glu::draw(context,dVar2,1,(VertexArrayBinding *)local_248,
            (PrimitiveList *)&rendered.m_pixels.m_cap,(DrawUtilCallback *)0x0);
  err = (*local_40->getError)();
  glu::checkError(err,"Draw failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fTessellationTests.cpp"
                  ,0xbdc);
  local_3a8 = (VertexArrayBinding *)&attrBindings[0].pointer.data;
  do {
    local_3a8 = local_3a8 + -1;
    glu::VertexArrayBinding::~VertexArrayBinding(local_3a8);
  } while (local_3a8 != (VertexArrayBinding *)local_248);
  std::vector<float,_std::allocator<float>_>::~vector((vector<float,_std::allocator<float>_> *)&f);
  getPixels((Surface *)&reference.m_data.m_cap,(RenderContext *)viewport._8_8_,
            (RandomViewport *)local_30);
  archive = tcu::TestContext::getArchive
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  getPNG((TextureLevel *)local_2d0,archive,&this->m_referenceImagePath);
  tcu::TextureLevel::getAccess(&local_300,(TextureLevel *)local_2d0);
  tcu::Surface::getAccess(&local_328,(Surface *)&reference.m_data.m_cap);
  local_2d1 = tcu::fuzzyCompare(this_00,"ImageComparison","Image Comparison",&local_300,&local_328,
                                0.02,COMPARE_LOG_RESULT);
  pcVar3 = "Image comparison failed";
  if ((bool)local_2d1) {
    pcVar3 = "Pass";
  }
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
             (byte)~local_2d1 & QP_TEST_RESULT_FAIL,pcVar3);
  tcu::TextureLevel::~TextureLevel((TextureLevel *)local_2d0);
  tcu::Surface::~Surface((Surface *)&reference.m_data.m_cap);
  return STOP;
}

Assistant:

PatchVertexCountCase::IterateResult PatchVertexCountCase::iterate (void)
{
	TestLog&					log						= m_testCtx.getLog();
	const RenderContext&		renderCtx				= m_context.getRenderContext();
	const RandomViewport		viewport				(renderCtx.getRenderTarget(), RENDER_SIZE, RENDER_SIZE, deStringHash(getName()));
	const deUint32				programGL				= m_program->getProgram();
	const glw::Functions&		gl						= renderCtx.getFunctions();

	setViewport(gl, viewport);
	gl.clearColor(0.0f, 0.0f, 0.0f, 1.0f);
	gl.useProgram(programGL);

	log << TestLog::Message << "Note: input patch size is " << m_inputPatchSize << ", output patch size is " << m_outputPatchSize << TestLog::EndMessage;

	{
		vector<float> attributeData;
		attributeData.reserve(m_inputPatchSize);

		for (int i = 0; i < m_inputPatchSize; i++)
		{
			const float f = (float)i / (float)(m_inputPatchSize-1);
			attributeData.push_back(f*f);
		}

		gl.patchParameteri(GL_PATCH_VERTICES, m_inputPatchSize);
		gl.clear(GL_COLOR_BUFFER_BIT);

		const glu::VertexArrayBinding attrBindings[] =
		{
			glu::va::Float("in_v_attr", 1, (int)attributeData.size(), 0, &attributeData[0])
		};

		glu::draw(m_context.getRenderContext(), programGL, DE_LENGTH_OF_ARRAY(attrBindings), &attrBindings[0],
			glu::pr::Patches(m_inputPatchSize));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Draw failed");
	}

	{
		const tcu::Surface			rendered	= getPixels(renderCtx, viewport);
		const tcu::TextureLevel		reference	= getPNG(m_testCtx.getArchive(), m_referenceImagePath);
		const bool					success		= tcu::fuzzyCompare(log, "ImageComparison", "Image Comparison", reference.getAccess(), rendered.getAccess(), 0.02f, tcu::COMPARE_LOG_RESULT);

		m_testCtx.setTestResult(success ? QP_TEST_RESULT_PASS : QP_TEST_RESULT_FAIL, success ? "Pass" : "Image comparison failed");
		return STOP;
	}
}